

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

WeierstrassPoint * ecdsa_decode(ptrlen encoded,ec_curve *curve)

{
  byte bVar1;
  uint uVar2;
  ulong wanted;
  mp_int *pmVar3;
  mp_int *y_00;
  ptrlen pVar4;
  mp_int *y;
  mp_int *x;
  size_t len;
  WeierstrassPoint *P;
  undefined1 local_58 [7];
  uchar format_type;
  BinarySource src [1];
  ec_curve *curve_local;
  ptrlen encoded_local;
  
  if (curve->type != EC_WEIERSTRASS) {
    __assert_fail("curve->type == EC_WEIERSTRASS",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                  ,0x1a2,"WeierstrassPoint *ecdsa_decode(ptrlen, const struct ec_curve *)");
  }
  BinarySource_INIT__((BinarySource *)local_58,encoded);
  bVar1 = BinarySource_get_byte((BinarySource *)src[0]._24_8_);
  wanted = *(long *)(src[0]._24_8_ + 0x10) - *(long *)(src[0]._24_8_ + 8);
  uVar2 = (uint)bVar1;
  if (uVar2 == 0) {
    len = (size_t)ecc_weierstrass_point_new_identity((curve->field_6).w.wc);
  }
  else if (uVar2 - 2 < 2) {
    pVar4 = BinarySource_get_data((BinarySource *)src[0]._24_8_,wanted);
    pmVar3 = mp_from_bytes_be(pVar4);
    len = (size_t)ecc_weierstrass_point_new_from_x((curve->field_6).w.wc,pmVar3,bVar1 & 1);
    mp_free(pmVar3);
    if ((WeierstrassPoint *)len == (WeierstrassPoint *)0x0) {
      return (WeierstrassPoint *)0x0;
    }
  }
  else {
    if (uVar2 != 4) {
      return (WeierstrassPoint *)0x0;
    }
    if ((wanted & 1) != 0) {
      return (WeierstrassPoint *)0x0;
    }
    pVar4 = BinarySource_get_data((BinarySource *)src[0]._24_8_,wanted >> 1);
    pmVar3 = mp_from_bytes_be(pVar4);
    pVar4 = BinarySource_get_data((BinarySource *)src[0]._24_8_,wanted >> 1);
    y_00 = mp_from_bytes_be(pVar4);
    len = (size_t)ecc_weierstrass_point_new((curve->field_6).w.wc,pmVar3,y_00);
    mp_free(pmVar3);
    mp_free(y_00);
  }
  uVar2 = ecc_weierstrass_point_valid((WeierstrassPoint *)len);
  if (uVar2 == 0) {
    ecc_weierstrass_point_free((WeierstrassPoint *)len);
    encoded_local.len = 0;
  }
  else {
    encoded_local.len = len;
  }
  return (WeierstrassPoint *)encoded_local.len;
}

Assistant:

static WeierstrassPoint *ecdsa_decode(
    ptrlen encoded, const struct ec_curve *curve)
{
    assert(curve->type == EC_WEIERSTRASS);
    BinarySource src[1];

    BinarySource_BARE_INIT_PL(src, encoded);
    unsigned char format_type = get_byte(src);

    WeierstrassPoint *P;

    size_t len = get_avail(src);
    mp_int *x;
    mp_int *y;

    switch (format_type) {
      case 0:
        /* The identity. */
        P = ecc_weierstrass_point_new_identity(curve->w.wc);
        break;
      case 2:
      case 3:
        /* A compressed point, in which the x-coordinate is stored in
         * full, and y is deduced from that and a single bit
         * indicating its parity (stored in the format type byte). */
        x = mp_from_bytes_be(get_data(src, len));
        P = ecc_weierstrass_point_new_from_x(curve->w.wc, x, format_type & 1);
        mp_free(x);
        if (!P)            /* this can fail if the input is invalid */
            return NULL;
        break;
      case 4:
        /* An uncompressed point: the x,y coordinates are stored in
         * full. We expect the rest of the string to have even length,
         * and be divided half and half between the two values. */
        if (len % 2 != 0)
            return NULL;
        len /= 2;
        x = mp_from_bytes_be(get_data(src, len));
        y = mp_from_bytes_be(get_data(src, len));
        P = ecc_weierstrass_point_new(curve->w.wc, x, y);
        mp_free(x);
        mp_free(y);
        break;
      default:
        /* An unrecognised type byte. */
        return NULL;
    }

    /* Verify the point is on the curve */
    if (!ecc_weierstrass_point_valid(P)) {
        ecc_weierstrass_point_free(P);
        return NULL;
    }

    return P;
}